

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# volume.cpp
# Opt level: O2

bool __thiscall VolumeFile::load(VolumeFile *this,string *filePath)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  vector<unsigned_char,_std::allocator<unsigned_char>_> headerData;
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> local_48;
  
  std::__cxx11::string::string((string *)&local_48,(string *)filePath);
  std::__cxx11::string::operator=((string *)&this->m_origPath,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  boost::filesystem::path::parent_path();
  std::__cxx11::string::operator=((string *)&this->m_basePath,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  boost::filesystem::path::filename();
  std::__cxx11::string::operator=((string *)&this->m_baseName,(string *)&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  bVar1 = prepareStream(&this->m_mainStream,filePath,&this->m_mainFileSize);
  if (bVar1) {
    local_48._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_48._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    iVar2 = (*this->_vptr_VolumeFile[3])(this);
    bVar1 = readDataAt(this,(vector<unsigned_char,_std::allocator<unsigned_char>_> *)&local_48,0,
                       CONCAT44(extraout_var,iVar2));
    if (((bVar1) &&
        (iVar2 = (*this->_vptr_VolumeFile[7])
                           (this,local_48._M_impl.super__Vector_impl_data._M_start,
                            (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                            (long)local_48._M_impl.super__Vector_impl_data._M_start),
        (char)iVar2 != '\0')) &&
       (iVar2 = (*this->_vptr_VolumeFile[6])
                          (this,local_48._M_impl.super__Vector_impl_data._M_start,
                           (long)local_48._M_impl.super__Vector_impl_data._M_finish -
                           (long)local_48._M_impl.super__Vector_impl_data._M_start),
       (char)iVar2 != '\0')) {
      bVar1 = parseSegment(this);
    }
    else {
      bVar1 = false;
    }
    std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&local_48);
    return bVar1;
  }
  return false;
}

Assistant:

bool VolumeFile::load(const std::string& filePath)
{
	m_origPath = boost::filesystem::path(filePath);
	m_basePath = m_origPath.parent_path();
	m_baseName = m_origPath.filename();

	if (!prepareStream(m_mainStream, filePath, &m_mainFileSize)) {
		return false;
	}

	std::vector<uint8_t> headerData;
	if (!readDataAt(headerData, 0, getHeaderSize())) {
		return false;
	}
	if (!decryptHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseHeader(headerData.data(), headerData.size())) {
		return false;
	}
	if (!parseSegment()) {
		return false;
	}

	return true;
}